

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildCommand.cxx
# Opt level: O1

cmCTestGenericHandler * __thiscall cmCTestBuildCommand::InitializeHandler(cmCTestBuildCommand *this)

{
  cmMakefile *pcVar1;
  pointer pcVar2;
  cmGlobalGenerator *pcVar3;
  cmCTest *pcVar4;
  undefined8 uVar5;
  int iVar6;
  cmCTestBuildHandler *pcVar7;
  string *psVar8;
  string *psVar9;
  string *psVar10;
  cmake *gname;
  ostream *poVar11;
  cmValue cVar12;
  bool bVar13;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string cmakeBuildConfiguration;
  string buildCommand;
  string dir;
  ostringstream cmCTestLog_msg;
  string local_288;
  string local_268;
  string *local_248;
  string local_240;
  string local_220;
  string local_200;
  long *local_1c8;
  long local_1b8 [2];
  undefined1 local_1a8 [16];
  undefined1 local_198 [360];
  
  pcVar7 = cmCTest::GetBuildHandler((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
  (*(pcVar7->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler[3])(pcVar7);
  this->Handler = pcVar7;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  local_1a8._0_8_ = (cmGlobalGenerator *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CTEST_BUILD_COMMAND","");
  psVar8 = (string *)cmMakefile::GetDefinition(pcVar1,(string *)local_1a8);
  if ((cmGlobalGenerator *)local_1a8._0_8_ != (cmGlobalGenerator *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
  }
  if ((psVar8 == (string *)0x0) || (psVar8->_M_string_length == 0)) {
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    local_1a8._0_8_ = (cmGlobalGenerator *)local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CTEST_CMAKE_GENERATOR","");
    psVar8 = (string *)cmMakefile::GetDefinition(pcVar1,(string *)local_1a8);
    if ((cmGlobalGenerator *)local_1a8._0_8_ != (cmGlobalGenerator *)local_198) {
      operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
    }
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    local_1a8._0_8_ = (cmGlobalGenerator *)local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"CTEST_BUILD_CONFIGURATION","");
    psVar9 = (string *)cmMakefile::GetDefinition(pcVar1,(string *)local_1a8);
    if ((cmGlobalGenerator *)local_1a8._0_8_ != (cmGlobalGenerator *)local_198) {
      operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
    }
    if ((this->Configuration)._M_string_length == 0) {
      if ((psVar9 == (string *)0x0) || (psVar9->_M_string_length == 0)) {
        psVar9 = cmCTest::GetConfigType_abi_cxx11_
                           ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
      }
      else if (psVar9 == (string *)0x0) {
        psVar9 = &cmValue::Empty_abi_cxx11_;
      }
    }
    else {
      psVar9 = &this->Configuration;
    }
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    pcVar2 = (psVar9->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_288,pcVar2,pcVar2 + psVar9->_M_string_length);
    if ((this->Flags)._M_string_length == 0) {
      pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"CTEST_BUILD_FLAGS","");
      local_248 = cmMakefile::GetSafeDefinition(pcVar1,&local_220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_248 = &this->Flags;
    }
    if ((this->Target)._M_string_length == 0) {
      pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"CTEST_BUILD_TARGET","");
      psVar9 = cmMakefile::GetSafeDefinition(pcVar1,&local_240);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      psVar9 = &this->Target;
    }
    if ((psVar8 == (string *)0x0) || (psVar8->_M_string_length == 0)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "has no project to build. If this is a \"built with CMake\" project, verify that CTEST_CMAKE_GENERATOR is set. Otherwise, set CTEST_BUILD_COMMAND to build the project with a custom command line."
                 ,0xbf);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError((cmCommand *)this,&local_200);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,
                        (ulong)(local_200.field_2._M_allocated_capacity + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_198 + 0x60));
LAB_0025d37b:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      return (cmCTestGenericHandler *)0x0;
    }
    if (local_288._M_string_length == 0) {
      std::__cxx11::string::_M_replace((ulong)&local_288,0,(char *)0x0,0x88e252);
    }
    pcVar3 = (this->GlobalGenerator)._M_t.
             super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
             super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
    if (pcVar3 != (cmGlobalGenerator *)0x0) {
      (*pcVar3->_vptr_cmGlobalGenerator[3])(local_1a8);
      psVar10 = psVar8;
      if (psVar8 == (string *)0x0) {
        psVar10 = &cmValue::Empty_abi_cxx11_;
      }
      bVar13 = true;
      if ((pointer)local_1a8._8_8_ == (pointer)psVar10->_M_string_length) {
        if ((pointer)local_1a8._8_8_ == (pointer)0x0) {
          bVar13 = false;
        }
        else {
          iVar6 = bcmp((void *)local_1a8._0_8_,(psVar10->_M_dataplus)._M_p,local_1a8._8_8_);
          bVar13 = iVar6 != 0;
        }
      }
      if ((cmGlobalGenerator *)local_1a8._0_8_ != (cmGlobalGenerator *)local_198) {
        operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
      }
      if (bVar13) {
        pcVar3 = (this->GlobalGenerator)._M_t.
                 super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                 .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
        (this->GlobalGenerator)._M_t.
        super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
        super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
        super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl = (cmGlobalGenerator *)0x0;
        if (pcVar3 != (cmGlobalGenerator *)0x0) {
          (*pcVar3->_vptr_cmGlobalGenerator[1])();
        }
      }
    }
    if ((this->GlobalGenerator)._M_t.
        super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
        super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
        super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl == (cmGlobalGenerator *)0x0)
    {
      gname = cmMakefile::GetCMakeInstance
                        ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.
                         Makefile);
      if (psVar8 == (string *)0x0) {
        psVar8 = &cmValue::Empty_abi_cxx11_;
      }
      cmake::CreateGlobalGenerator((cmake *)local_1a8,(string *)gname,SUB81(psVar8,0));
      uVar5 = local_1a8._0_8_;
      local_1a8._0_8_ = (cmGlobalGenerator *)0x0;
      pcVar3 = (this->GlobalGenerator)._M_t.
               super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
               super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
      (this->GlobalGenerator)._M_t.
      super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
      super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
      super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl = (cmGlobalGenerator *)uVar5;
      if (pcVar3 != (cmGlobalGenerator *)0x0) {
        (*pcVar3->_vptr_cmGlobalGenerator[1])();
      }
      if ((cmGlobalGenerator *)local_1a8._0_8_ != (cmGlobalGenerator *)0x0) {
        (**(code **)(*(long *)local_1a8._0_8_ + 8))();
      }
      if ((this->GlobalGenerator)._M_t.
          super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
          super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
          super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl == (cmGlobalGenerator *)0x0
         ) {
        local_1a8._0_8_ = (cmGlobalGenerator *)0x22;
        local_1a8._8_8_ = "could not create generator named \"";
        local_198._0_8_ = (_func_int **)0x0;
        local_198._16_8_ = (psVar8->_M_dataplus)._M_p;
        local_198._8_8_ = psVar8->_M_string_length;
        local_198._24_8_ = (pointer)0x0;
        local_200.field_2._M_allocated_capacity = (long)&local_200.field_2 + 8;
        local_200._M_dataplus._M_p = (pointer)0x0;
        local_200._M_string_length = 1;
        local_200.field_2._M_local_buf[8] = '\"';
        local_198._32_8_ = 1;
        local_198._48_8_ = (_Base_ptr)0x0;
        views._M_len = 3;
        views._M_array = (iterator)local_1a8;
        local_198._40_8_ = local_200.field_2._M_allocated_capacity;
        cmCatViews(&local_268,views);
        cmMakefile::IssueMessage
                  ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile
                   ,FATAL_ERROR,&local_268);
        cmSystemTools::s_FatalErrorOccurred = true;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        goto LAB_0025d37b;
      }
    }
    if (local_288._M_string_length == 0) {
      std::__cxx11::string::_M_replace((ulong)&local_288,0,(char *)0x0,0x94b4c9);
    }
    pcVar4 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    local_1a8._0_8_ = (cmGlobalGenerator *)local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"BuildDirectory","");
    cmCTest::GetCTestConfiguration(&local_200,pcVar4,(string *)local_1a8);
    if ((cmGlobalGenerator *)local_1a8._0_8_ != (cmGlobalGenerator *)local_198) {
      operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
    }
    pcVar3 = (this->GlobalGenerator)._M_t.
             super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
             super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
    bVar13 = cmMakefile::IgnoreErrorsCMP0061
                       ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.
                        Makefile);
    cmGlobalGenerator::GenerateCMakeBuildCommand
              (&local_268,pcVar3,psVar9,&local_288,&this->ParallelLevel,local_248,bVar13);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"SetMakeCommand:",0xf);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
    pcVar4 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar4,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildCommand.cxx"
                 ,0x70,(char *)local_1c8,(this->super_cmCTestHandlerCommand).Quiet);
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8,local_1b8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x60));
    cmCTest::SetCTestConfiguration
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"MakeCommand",
               &local_268,(this->super_cmCTestHandlerCommand).Quiet);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,
                      (ulong)(local_200.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (psVar8 == (string *)0x0) {
      psVar8 = &cmValue::Empty_abi_cxx11_;
    }
    cmCTest::SetCTestConfiguration
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"MakeCommand",psVar8,
               (this->super_cmCTestHandlerCommand).Quiet);
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  local_1a8._0_8_ = (cmGlobalGenerator *)local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CTEST_USE_LAUNCHERS","");
  cVar12 = cmMakefile::GetDefinition(pcVar1,(string *)local_1a8);
  if ((cmGlobalGenerator *)local_1a8._0_8_ != (cmGlobalGenerator *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
  }
  if (cVar12.Value != (string *)0x0) {
    cmCTest::SetCTestConfiguration
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"UseLaunchers",
               cVar12.Value,(this->super_cmCTestHandlerCommand).Quiet);
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  local_1a8._0_8_ = (cmGlobalGenerator *)local_198;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CTEST_LABELS_FOR_SUBPROJECTS","");
  cVar12 = cmMakefile::GetDefinition(pcVar1,(string *)local_1a8);
  if ((cmGlobalGenerator *)local_1a8._0_8_ != (cmGlobalGenerator *)local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198._0_8_ + 1);
  }
  if (cVar12.Value != (string *)0x0) {
    cmCTest::SetCTestConfiguration
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"LabelsForSubprojects"
               ,cVar12.Value,(this->super_cmCTestHandlerCommand).Quiet);
  }
  (pcVar7->super_cmCTestGenericHandler).Quiet = (this->super_cmCTestHandlerCommand).Quiet;
  return &pcVar7->super_cmCTestGenericHandler;
}

Assistant:

cmCTestGenericHandler* cmCTestBuildCommand::InitializeHandler()
{
  cmCTestBuildHandler* handler = this->CTest->GetBuildHandler();
  handler->Initialize();

  this->Handler = handler;

  cmValue ctestBuildCommand =
    this->Makefile->GetDefinition("CTEST_BUILD_COMMAND");
  if (cmNonempty(ctestBuildCommand)) {
    this->CTest->SetCTestConfiguration("MakeCommand", *ctestBuildCommand,
                                       this->Quiet);
  } else {
    cmValue cmakeGeneratorName =
      this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR");

    // Build configuration is determined by: CONFIGURATION argument,
    // or CTEST_BUILD_CONFIGURATION script variable, or
    // CTEST_CONFIGURATION_TYPE script variable, or ctest -C command
    // line argument... in that order.
    //
    cmValue ctestBuildConfiguration =
      this->Makefile->GetDefinition("CTEST_BUILD_CONFIGURATION");
    std::string cmakeBuildConfiguration = cmNonempty(this->Configuration)
      ? this->Configuration
      : cmNonempty(ctestBuildConfiguration) ? *ctestBuildConfiguration
                                            : this->CTest->GetConfigType();

    const std::string& cmakeBuildAdditionalFlags = cmNonempty(this->Flags)
      ? this->Flags
      : this->Makefile->GetSafeDefinition("CTEST_BUILD_FLAGS");
    const std::string& cmakeBuildTarget = cmNonempty(this->Target)
      ? this->Target
      : this->Makefile->GetSafeDefinition("CTEST_BUILD_TARGET");

    if (cmNonempty(cmakeGeneratorName)) {
      if (cmakeBuildConfiguration.empty()) {
        cmakeBuildConfiguration = "Release";
      }
      if (this->GlobalGenerator) {
        if (this->GlobalGenerator->GetName() != *cmakeGeneratorName) {
          this->GlobalGenerator.reset();
        }
      }
      if (!this->GlobalGenerator) {
        this->GlobalGenerator =
          this->Makefile->GetCMakeInstance()->CreateGlobalGenerator(
            *cmakeGeneratorName);
        if (!this->GlobalGenerator) {
          std::string e = cmStrCat("could not create generator named \"",
                                   *cmakeGeneratorName, '"');
          this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e);
          cmSystemTools::SetFatalErrorOccurred();
          return nullptr;
        }
      }
      if (cmakeBuildConfiguration.empty()) {
        cmakeBuildConfiguration = "Debug";
      }

      std::string dir = this->CTest->GetCTestConfiguration("BuildDirectory");
      std::string buildCommand =
        this->GlobalGenerator->GenerateCMakeBuildCommand(
          cmakeBuildTarget, cmakeBuildConfiguration, this->ParallelLevel,
          cmakeBuildAdditionalFlags, this->Makefile->IgnoreErrorsCMP0061());
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "SetMakeCommand:" << buildCommand << "\n",
                         this->Quiet);
      this->CTest->SetCTestConfiguration("MakeCommand", buildCommand,
                                         this->Quiet);
    } else {
      std::ostringstream ostr;
      /* clang-format off */
      ostr << "has no project to build. If this is a "
        "\"built with CMake\" project, verify that CTEST_CMAKE_GENERATOR "
        "is set. Otherwise, set CTEST_BUILD_COMMAND to build the project "
        "with a custom command line.";
      /* clang-format on */
      this->SetError(ostr.str());
      return nullptr;
    }
  }

  if (cmValue useLaunchers =
        this->Makefile->GetDefinition("CTEST_USE_LAUNCHERS")) {
    this->CTest->SetCTestConfiguration("UseLaunchers", *useLaunchers,
                                       this->Quiet);
  }

  if (cmValue labelsForSubprojects =
        this->Makefile->GetDefinition("CTEST_LABELS_FOR_SUBPROJECTS")) {
    this->CTest->SetCTestConfiguration("LabelsForSubprojects",
                                       *labelsForSubprojects, this->Quiet);
  }

  handler->SetQuiet(this->Quiet);
  return handler;
}